

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FPolySeg,_FPolySeg>::DoCopy
          (TArray<FPolySeg,_FPolySeg> *this,TArray<FPolySeg,_FPolySeg> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  FPolySeg *pFVar4;
  undefined8 uVar5;
  FPolySeg *pFVar6;
  long lVar7;
  
  uVar3 = other->Count;
  this->Count = uVar3;
  this->Most = uVar3;
  if ((ulong)uVar3 == 0) {
    this->Array = (FPolySeg *)0x0;
  }
  else {
    pFVar6 = (FPolySeg *)
             M_Malloc_Dbg((ulong)uVar3 * 0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                          ,0x19e);
    this->Array = pFVar6;
    uVar3 = this->Count;
    if ((ulong)uVar3 != 0) {
      pFVar4 = other->Array;
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pFVar4->v1).pos.X + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pFVar6->v1).pos.X + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar1 = (undefined8 *)((long)&(pFVar4->v2).pos.X + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pFVar6->v2).pos.X + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        *(undefined8 *)((long)&pFVar6->wall + lVar7) = *(undefined8 *)((long)&pFVar4->wall + lVar7);
        lVar7 = lVar7 + 0x28;
      } while ((ulong)uVar3 * 0x28 != lVar7);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}